

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void process_player_cleanup(void)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  monster_conflict *mon_2;
  monster_conflict *mon_1;
  monster_conflict *mon;
  wchar_t i;
  
  if (player->upkeep->energy_use == L'\0') {
    if (1 < player->skip_cmd_coercion) {
      player->skip_cmd_coercion = '\x01';
    }
  }
  else {
    player->energy = player->energy - (short)player->upkeep->energy_use;
    player->total_energy = player->upkeep->energy_use + player->total_energy;
    if (player->skip_cmd_coercion != '\0') {
      player->skip_cmd_coercion = player->skip_cmd_coercion + 0xff;
    }
    player_take_terrain_damage(player,player->grid);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    _Var1 = square_isfall((chunk *)cave,grid);
    if (_Var1) {
      player_fall_off_cliff(player);
      return;
    }
    if ((player->upkeep->dropping & 1U) == 0) {
      if (player->timed[6] != 0) {
        player->upkeep->redraw = player->upkeep->redraw | 0x10000;
      }
      for (mon._4_4_ = L'\x01'; wVar2 = cave_monster_max(cave), mon._4_4_ < wVar2;
          mon._4_4_ = mon._4_4_ + L'\x01') {
        pmVar3 = cave_monster(cave,mon._4_4_);
        if ((pmVar3->race != (monster_race *)0x0) &&
           (_Var1 = flag_has_dbg(pmVar3->race->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI"),
           _Var1)) {
          square_light_spot((chunk *)cave,pmVar3->grid);
        }
      }
      for (mon._4_4_ = L'\x01'; wVar2 = cave_monster_max(cave), mon._4_4_ < wVar2;
          mon._4_4_ = mon._4_4_ + L'\x01') {
        pmVar3 = cave_monster(cave,mon._4_4_);
        flag_off(pmVar3->mflag,2,3);
        _Var1 = flag_has_dbg(pmVar3->mflag,2,5,"mon->mflag","MFLAG_MARK");
        if ((_Var1) && (_Var1 = flag_has_dbg(pmVar3->mflag,2,4,"mon->mflag","MFLAG_SHOW"), !_Var1))
        {
          flag_off(pmVar3->mflag,2,5);
          update_mon((monster *)pmVar3,(chunk *)cave,false);
        }
      }
    }
  }
  for (mon._4_4_ = L'\x01'; wVar2 = cave_monster_max(cave), mon._4_4_ < wVar2;
      mon._4_4_ = mon._4_4_ + L'\x01') {
    pmVar3 = cave_monster(cave,mon._4_4_);
    flag_off(pmVar3->mflag,2,4);
  }
  player->upkeep->dropping = false;
  update_stuff(player);
  redraw_stuff(player);
  return;
}

Assistant:

static void process_player_cleanup(void)
{
	int i;

	/* Significant */
	if (player->upkeep->energy_use) {
		/* Use some energy */
		player->energy -= player->upkeep->energy_use;

		/* Increment the total energy counter */
		player->total_energy += player->upkeep->energy_use;

		/*
		 * Since the player used energy, the command wasn't
		 * canceled.  Therefore allow the bloodlust check on
		 * the player's next command unless this was a background
		 * command and the last player-issued command passed the
		 * bloodlust check but was canceled (skip_cmd_coercion is two
		 * in that case).
		 */
		if (player->skip_cmd_coercion) {
			--player->skip_cmd_coercion;
		}

		/* Player can be damaged by terrain */
		player_take_terrain_damage(player, player->grid);

		/* Player can be moved by terrain (or lack of it) */
		if (square_isfall(cave, player->grid)) {
			player_fall_off_cliff(player);
			return;
		}

		/* Do nothing else if player has auto-dropped stuff */
		if (!player->upkeep->dropping) {
			/* Hack -- constant hallucination */
			if (player->timed[TMD_IMAGE])
				player->upkeep->redraw |= (PR_MAP);

			/* Shimmer multi-hued monsters */
			for (i = 1; i < cave_monster_max(cave); i++) {
				struct monster *mon = cave_monster(cave, i);
				if (!mon->race)
					continue;
				if (!rf_has(mon->race->flags, RF_ATTR_MULTI))
					continue;
				square_light_spot(cave, mon->grid);
			}

			/* Clear NICE flag, and show marked monsters */
			for (i = 1; i < cave_monster_max(cave); i++) {
				struct monster *mon = cave_monster(cave, i);
				mflag_off(mon->mflag, MFLAG_NICE);
				if (mflag_has(mon->mflag, MFLAG_MARK)) {
					if (!mflag_has(mon->mflag, MFLAG_SHOW)) {
						mflag_off(mon->mflag, MFLAG_MARK);
						update_mon(mon, cave, false);
					}
				}
			}
		}
	} else if (player->skip_cmd_coercion > 1) {
		/*
		 * The last command was a backround command executing while
		 * skipping the bloodlust check on the player's next command.
		 * Set skip_cmd_coercion back to one in preparation for the
		 * player's next turn.
		 */
		player->skip_cmd_coercion = 1;
	}

	/* Clear SHOW flag and player drop status */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		mflag_off(mon->mflag, MFLAG_SHOW);
	}
	player->upkeep->dropping = false;

	/* Hack - update needed first because inventory may have changed */
	update_stuff(player);
	redraw_stuff(player);
}